

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

char * __thiscall QPDFObjectHandle::getTypeName(QPDFObjectHandle *this)

{
  bool bVar1;
  qpdf_object_type_e qVar2;
  const_reference ppcVar3;
  char *local_20;
  QPDFObjectHandle *this_local;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if (bVar1) {
    qVar2 = getTypeCode(this);
    ppcVar3 = std::array<const_char_*,_16UL>::operator[](&getTypeName::tn,(ulong)qVar2);
    local_20 = *ppcVar3;
  }
  else {
    local_20 = "uninitialized";
  }
  return local_20;
}

Assistant:

char const*
QPDFObjectHandle::getTypeName() const
{
    static constexpr std::array<char const*, 16> tn{
        "uninitialized",
        "reserved",
        "null",
        "boolean",
        "integer",
        "real",
        "string",
        "name",
        "array",
        "dictionary",
        "stream",
        "operator",
        "inline-image",
        "unresolved",
        "destroyed",
        "reference"};
    return obj ? tn[getTypeCode()] : "uninitialized";
}